

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int makesky(int argc,char **argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  bool bVar4;
  Allocator alloc;
  int i;
  _Any_data *onError;
  Point2i resolution_00;
  char *pcVar5;
  long lVar6;
  float fVar7;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  int resolution;
  Float elevation;
  Float turbidity;
  allocator<char> local_3b8;
  allocator<char> local_3b7;
  allocator<char> local_3b6;
  allocator<char> local_3b5;
  Float albedo;
  RGBColorSpace *colorSpace;
  float local_3a4;
  char **argv_local;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  vector<float,_std::allocator<float>_> lambda;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  Vector3f sunDir;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  ArHosekSkyModelState *skymodel_state;
  string outfile;
  _Any_data local_298;
  code *pcStack_288;
  code *pcStack_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  SpectrumHandle local_258;
  ColorEncodingHandle local_250;
  ImageMetadata metadata;
  Image img;
  
  outfile._M_dataplus._M_p = (pointer)&outfile.field_2;
  outfile._M_string_length = 0;
  outfile.field_2._M_local_buf[0] = '\0';
  albedo = 0.5;
  turbidity = 3.0;
  elevation = 10.0;
  resolution = 0x800;
  argv_local = argv;
  do {
    while( true ) {
      if (*argv_local == (char *)0x0) {
        if (outfile._M_string_length == 0) {
          pcVar5 = "--outfile must be specified";
        }
        else {
          pcVar5 = "--albedo must be between 0 and 1";
          if ((((0.0 <= albedo) && (albedo <= 1.0)) &&
              (pcVar5 = "--turbidity must be between 1.7 and 10.", turbidity <= 10.0)) &&
             (((1.7 <= turbidity &&
               (pcVar5 = "--elevation must be between 0. and 90.", 0.0 <= elevation)) &&
              (elevation <= 90.0)))) {
            elevation = elevation * 0.017453292;
            if (0 < resolution) {
              local_3a4 = cosf(elevation);
              sunDir.super_Tuple3<pbrt::Vector3,_float>.z = sinf(elevation);
              iVar2 = resolution;
              sunDir.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
              sunDir.super_Tuple3<pbrt::Vector3,_float>.y = local_3a4;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&metadata,"R",(allocator<char> *)&lambda);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)(metadata.cameraFromWorld.optionalValue.__data + 0x18),"G",
                         (allocator<char> *)&skymodel_state);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)(metadata.cameraFromWorld.optionalValue.__data + 0x38),"B",
                         (allocator<char> *)&colorSpace);
              local_250.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                       )0;
              alloc.memoryResource = pstd::pmr::new_delete_resource();
              resolution_00.super_Tuple2<pbrt::Point2,_int>.y = iVar2;
              resolution_00.super_Tuple2<pbrt::Point2,_int>.x = iVar2;
              channels.n = 3;
              channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &metadata;
              pbrt::Image::Image(&img,Float,resolution_00,channels,&local_250,alloc);
              lVar6 = 0x40;
              do {
                std::__cxx11::string::~string
                          ((string *)((long)&metadata.renderTimeSeconds.optionalValue + lVar6));
                lVar6 = lVar6 + -0x20;
              } while (lVar6 != -0x20);
              metadata.renderTimeSeconds.optionalValue =
                   (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
              std::vector<float,_std::allocator<float>_>::vector
                        (&lambda,0xd,(value_type *)&metadata,(allocator_type *)&skymodel_state);
              for (lVar6 = 0; lVar6 != 0xd; lVar6 = lVar6 + 1) {
                fVar7 = (float)(int)lVar6 / 12.0;
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * 720.0)),ZEXT416((uint)(1.0 - fVar7))
                                         ,SUB6416(ZEXT464(0x43a00000),0));
                lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6] = auVar1._0_4_;
              }
              skymodel_state =
                   arhosekskymodelstate_alloc_init
                             ((double)elevation,(double)turbidity,(double)albedo);
              colorSpace = pbrt::RGBColorSpace::ACES2065_1;
              local_258.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                       )((ulong)&pbrt::RGBColorSpace::ACES2065_1->illuminant | 0x2000000000000);
              pbrt::SpectrumToXYZ(&local_258);
              lVar6 = (long)resolution;
              local_298._M_unused._M_object = (void *)0x0;
              local_298._8_8_ = 0;
              pcStack_288 = (code *)0x0;
              pcStack_280 = (code *)0x0;
              local_298._M_unused._M_object = operator_new(0x30);
              *(vector<float,_std::allocator<float>_> **)local_298._M_unused._0_8_ = &lambda;
              *(int **)((long)local_298._M_unused._0_8_ + 8) = &resolution;
              *(Vector3f **)((long)local_298._M_unused._0_8_ + 0x10) = &sunDir;
              *(allocator_type **)((long)local_298._M_unused._0_8_ + 0x18) =
                   (allocator_type *)&skymodel_state;
              *(allocator<char> **)((long)local_298._M_unused._0_8_ + 0x20) =
                   (allocator<char> *)&colorSpace;
              *(Image **)((long)local_298._M_unused._0_8_ + 0x28) = &img;
              pcStack_280 = std::
                            _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:279:32)>
                            ::_M_invoke;
              pcStack_288 = std::
                            _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:279:32)>
                            ::_M_manager;
              pbrt::ParallelFor(0,lVar6,(function<void_(long,_long)> *)&local_298);
              std::_Function_base::~_Function_base((_Function_base *)&local_298);
              metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
              metadata.renderTimeSeconds.set = false;
              metadata.cameraFromWorld.set = false;
              metadata.NDCFromWorld.set = false;
              metadata.pixelBounds.set = false;
              metadata.fullResolution.set = false;
              metadata.samplesPerPixel.set = false;
              metadata.MSE.set = false;
              metadata.colorSpace.set = false;
              metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
                        (&metadata.colorSpace,&colorSpace);
              bVar3 = pbrt::Image::Write(&img,&outfile,&metadata);
              if (!bVar3) {
                pbrt::LogFatal<char_const(&)[29]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                           ,0x13a,"Check failed: %s",(char (*) [29])"img.Write(outfile, metadata)");
              }
              pbrt::ImageMetadata::~ImageMetadata(&metadata);
              std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                        (&lambda.super__Vector_base<float,_std::allocator<float>_>);
              pbrt::Image::~Image(&img);
              std::__cxx11::string::~string((string *)&outfile);
              return 0;
            }
            pcVar5 = "--resolution must be >= 1";
          }
        }
        usage("makesky",pcVar5);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&img,"outfile",(allocator<char> *)&colorSpace);
      local_398._M_unused._M_object = (void *)0x0;
      local_398._8_8_ = 0;
      local_380 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_invoke;
      local_388 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_manager;
      bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                        (&argv_local,(string *)&img,&outfile,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_398);
      if (!bVar3) break;
LAB_0025ac51:
      std::_Function_base::~_Function_base((_Function_base *)&local_398);
      std::__cxx11::string::~string((string *)&img);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&metadata,"albedo",&local_3b5);
    local_358._M_unused._M_object = (void *)0x0;
    local_358._8_8_ = 0;
    local_340 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_invoke;
    local_348 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_manager;
    bVar3 = pbrt::ParseArg<float*>
                      (&argv_local,(string *)&metadata,&albedo,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_358);
    if (bVar3) {
      std::_Function_base::~_Function_base((_Function_base *)&local_358);
      std::__cxx11::string::~string((string *)&metadata);
      goto LAB_0025ac51;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&lambda,"turbidity",&local_3b6);
    local_2f8._M_unused._M_object = (void *)0x0;
    local_2f8._8_8_ = 0;
    local_2e0 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_invoke;
    local_2e8 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_manager;
    onError = &local_2f8;
    bVar3 = pbrt::ParseArg<float*>
                      (&argv_local,(string *)&lambda,&turbidity,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)onError);
    bVar4 = true;
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&sunDir,"elevation",&local_3b7);
      local_318._M_unused._M_object = (void *)0x0;
      local_318._8_8_ = 0;
      local_300 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_invoke;
      local_308 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_manager;
      onError = &local_318;
      bVar3 = pbrt::ParseArg<float*>
                        (&argv_local,(string *)&sunDir,&elevation,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)onError);
      bVar4 = true;
      if (!bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&skymodel_state,"resolution",&local_3b8);
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        local_260 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_invoke;
        local_268 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_manager;
        onError = &local_278;
        bVar4 = pbrt::ParseArg<int*>
                          (&argv_local,(string *)&skymodel_state,&resolution,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_278);
        std::_Function_base::~_Function_base((_Function_base *)&local_278);
        std::__cxx11::string::~string((string *)&skymodel_state);
      }
      std::_Function_base::~_Function_base((_Function_base *)&local_318);
      std::__cxx11::string::~string((string *)&sunDir);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_2f8);
    std::__cxx11::string::~string((string *)&lambda);
    std::_Function_base::~_Function_base((_Function_base *)&local_358);
    std::__cxx11::string::~string((string *)&metadata);
    std::_Function_base::~_Function_base((_Function_base *)&local_398);
    std::__cxx11::string::~string((string *)&img);
    if (bVar4 == false) {
      pcVar5 = "argument %s invalid";
      pbrt::StringPrintf<char*&>
                ((string *)&img,(pbrt *)"argument %s invalid",(char *)argv_local,(char **)onError);
      makesky::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&img,(string *)pcVar5)
      ;
    }
  } while( true );
}

Assistant:

int makesky(int argc, char *argv[]) {
    std::string outfile;
    Float albedo = 0.5;
    Float turbidity = 3.;
    Float elevation = 10;
    int resolution = 2048;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("makesky", "%s", err.c_str());
            exit(1);
        };
        if (ParseArg(&argv, "outfile", &outfile, onError) ||
            ParseArg(&argv, "albedo", &albedo, onError) ||
            ParseArg(&argv, "turbidity", &turbidity, onError) ||
            ParseArg(&argv, "elevation", &elevation, onError) ||
            ParseArg(&argv, "resolution", &resolution, onError)) {
            // success
        } else
            onError(StringPrintf("argument %s invalid", *argv));
    }

    if (outfile.empty())
        usage("makesky", "--outfile must be specified");
    if (albedo < 0. || albedo > 1.)
        usage("makesky", "--albedo must be between 0 and 1");
    if (turbidity < 1.7 || turbidity > 10.)
        usage("makesky", "--turbidity must be between 1.7 and 10.");
    if (elevation < 0. || elevation > 90.)
        usage("makesky", "--elevation must be between 0. and 90.");
    elevation = Radians(elevation);
    if (resolution < 1)
        usage("makesky", "--resolution must be >= 1");

    // Vector pointing at the sun. Note that elevation is measured from the
    // horizon--not the zenith, as it is elsewhere in pbrt.
    Vector3f sunDir(0., std::cos(elevation), std::sin(elevation));

    Image img(PixelFormat::Float, {resolution, resolution}, {"R", "G", "B"});

    // They assert wavelengths are in this range...
    int nLambda = 1 + (720 - 320) / 32;
    std::vector<Float> lambda(nLambda, Float(0));
    for (int i = 0; i < nLambda; ++i)
        lambda[i] = Lerp(i / Float(nLambda - 1), 320, 720);

    // Assume a uniform spectral albedo
    ArHosekSkyModelState *skymodel_state =
        arhosekskymodelstate_alloc_init(elevation, turbidity, albedo);

    const RGBColorSpace *colorSpace = RGBColorSpace::ACES2065_1;
    XYZ illumXYZ = SpectrumToXYZ(&colorSpace->illuminant);

    ParallelFor(0, resolution, [&](int64_t start, int64_t end) {
        std::vector<Float> skyv(lambda.size());
        for (int64_t iy = start; iy < end; ++iy) {
            Float y = (iy + 0.5f) / resolution;
            for (int ix = 0; ix < resolution; ++ix) {
                Float x = (ix + 0.5f) / resolution;
                Vector3f v = EqualAreaSquareToSphere({x, y});
                if (v.z <= 0)
                    // downward hemisphere
                    continue;

                Float theta = SphericalTheta(v);

                // Compute the angle between the pixel's direction and the sun
                // direction.
                Float gamma = SafeACos(Dot(v, sunDir));
                DCHECK(gamma >= 0 && gamma <= Pi);

                for (int i = 0; i < lambda.size(); ++i)
                    skyv[i] = arhosekskymodel_solar_radiance(skymodel_state, theta, gamma,
                                                             lambda[i]);

                PiecewiseLinearSpectrum spec(pstd::MakeConstSpan(lambda),
                                             pstd::MakeConstSpan(skyv));
                XYZ xyz = SpectrumToXYZ(&spec);
                RGB rgb = colorSpace->ToRGB(xyz);

                for (int c = 0; c < 3; ++c)
                    img.SetChannel({ix, int(iy)}, c, rgb[c]);
            }
        }
    });

    ImageMetadata metadata;
    metadata.colorSpace = colorSpace;
    CHECK(img.Write(outfile, metadata));

    return 0;
}